

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  parasail_result_t *ppVar14;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  __m128i *palVar19;
  __m128i *palVar20;
  __m128i *palVar21;
  uint uVar22;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong size;
  long lVar33;
  uint uVar34;
  int iVar35;
  int iVar43;
  int iVar44;
  int iVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i alVar53;
  int iVar54;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i alVar58;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m128i alVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ulong uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_32_t h;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1c8 [16];
  long local_170;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  long local_118;
  ulong uStack_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  longlong local_48;
  longlong lStack_40;
  int iVar23;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse2_128_32_cold_6();
      }
      else {
        uVar13 = profile->s1Len;
        if ((int)uVar13 < 1) {
          parasail_nw_stats_table_scan_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse2_128_32_cold_4();
        }
        else {
          uVar31 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_1();
          }
          else {
            local_208._0_4_ = gap;
            iVar26 = uVar13 - 1;
            size = (ulong)uVar13 + 3 >> 2;
            iVar32 = (int)size;
            uVar34 = iVar26 % iVar32;
            iVar28 = -open;
            iVar9 = ppVar4->min;
            local_1c8._0_4_ = iVar28;
            uVar22 = 0x80000000 - iVar9;
            if (iVar9 != iVar28 && SBORROW4(iVar9,iVar28) == iVar9 + open < 0) {
              uVar22 = open | 0x80000000;
            }
            pvVar5 = (profile->profile32).matches;
            iVar9 = 0x7ffffffe - ppVar4->max;
            pvVar6 = (profile->profile32).similar;
            ppVar14 = parasail_result_new_table3((uint)((ulong)uVar13 + 3) & 0x7ffffffc,s2Len);
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag = ppVar14->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (ptr_02 == (__m128i *)0x0 ||
                           (ptr_01 == (__m128i *)0x0 ||
                           (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0))) ||
                           ((b_04 == (__m128i *)0x0 ||
                            (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                           ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                           (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
              if ((ptr_06 != (int32_t *)0x0 &&
                  (ptr_05 != (__m128i *)0x0 &&
                  (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))) &&
                  ((ptr_02 != (__m128i *)0x0 &&
                   (ptr_01 != (__m128i *)0x0 && (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0)
                   )) && ((b_04 != (__m128i *)0x0 &&
                          (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) &&
                         ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                         (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
                iVar10 = s2Len + -1;
                iVar11 = 3 - iVar26 / iVar32;
                iVar16 = uVar22 + 1;
                iVar12 = -(iVar32 * gap);
                c[0] = size;
                uVar18 = size;
                parasail_memset___m128i(b_03,c,size);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_04,c_00,uVar18);
                c_01[1] = extraout_RDX_01;
                c_01[0] = size;
                parasail_memset___m128i(b_05,c_01,uVar18);
                c_02[1] = extraout_RDX_02;
                c_02[0] = size;
                parasail_memset___m128i(b,c_02,uVar18);
                c_03[1] = extraout_RDX_03;
                c_03[0] = size;
                parasail_memset___m128i(b_00,c_03,uVar18);
                c_04[1] = extraout_RDX_04;
                c_04[0] = size;
                parasail_memset___m128i(b_01,c_04,uVar18);
                c_05[1] = extraout_RDX_05;
                c_05[0] = size;
                parasail_memset___m128i(b_02,c_05,uVar18);
                iVar54 = -open;
                iVar59 = -open;
                iVar60 = -open;
                iVar61 = -open;
                uVar13 = iVar32 - 1;
                lVar17 = (ulong)uVar13 << 4;
                iVar35 = 1;
                iVar43 = 1;
                iVar44 = 1;
                iVar45 = 1;
                uVar18 = size;
                do {
                  piVar1 = (int *)((long)*ptr_04 + lVar17);
                  *piVar1 = iVar54;
                  piVar1[1] = iVar59;
                  piVar1[2] = iVar60;
                  piVar1[3] = iVar61;
                  piVar1 = (int *)((long)*ptr_05 + lVar17);
                  *piVar1 = iVar35;
                  piVar1[1] = iVar43;
                  piVar1[2] = iVar44;
                  piVar1[3] = iVar45;
                  iVar54 = iVar54 - gap;
                  iVar59 = iVar59 - gap;
                  iVar60 = iVar60 - gap;
                  iVar61 = iVar61 - gap;
                  iVar35 = iVar35 + 1;
                  iVar43 = iVar43 + 1;
                  iVar44 = iVar44 + 1;
                  iVar45 = iVar45 + 1;
                  lVar17 = lVar17 + -0x10;
                  iVar23 = (int)uVar18;
                  uVar22 = iVar23 - 1;
                  uVar18 = (ulong)uVar22;
                } while (uVar22 != 0 && 0 < iVar23);
                uVar18 = 0;
                iVar54 = iVar28;
                do {
                  lVar17 = 0;
                  iVar59 = iVar54;
                  do {
                    *(int *)((long)&local_48 + lVar17 * 4) = iVar59;
                    lVar17 = lVar17 + 1;
                    iVar59 = iVar59 - iVar32 * gap;
                  } while (lVar17 != 4);
                  ptr[uVar18][0] = local_48;
                  ptr[uVar18][1] = lStack_40;
                  uVar18 = uVar18 + 1;
                  iVar54 = iVar54 - gap;
                } while (uVar18 != size);
                *ptr_06 = 0;
                uVar18 = 1;
                do {
                  ptr_06[uVar18] = iVar28;
                  uVar18 = uVar18 + 1;
                  iVar28 = iVar28 - gap;
                } while (s2Len + 1 != uVar18);
                palVar19 = ptr + uVar13;
                palVar20 = b_03 + uVar13;
                palVar21 = b_04 + uVar13;
                uVar18 = 1;
                if (1 < s2Len) {
                  uVar18 = uVar31;
                }
                lVar33 = (ulong)(iVar32 + (uint)(iVar32 == 0)) << 4;
                lVar29 = size * uVar31;
                lVar17 = lVar29 * 4;
                lVar30 = lVar29 * 8;
                lVar29 = lVar29 * 0xc;
                local_170 = 0;
                uVar25 = 0;
                local_158._4_4_ = iVar16;
                local_158._0_4_ = iVar16;
                local_158._12_4_ = iVar16;
                local_158._8_4_ = iVar16;
                local_148._4_4_ = iVar9;
                local_148._0_4_ = iVar9;
                local_148._12_4_ = iVar9;
                local_148._8_4_ = iVar9;
                do {
                  iStack_104 = (int)(*palVar21)[0];
                  iStack_100 = *(int *)((long)*palVar21 + 4);
                  iStack_fc = (int)(*palVar21)[1];
                  uVar75 = b_05[uVar13][0];
                  local_108 = 0;
                  local_118 = uVar75 << 0x20;
                  uStack_110 = b_05[uVar13][1] << 0x20 | uVar75 >> 0x20;
                  auVar7._4_8_ = in_XMM13._8_8_;
                  auVar7._0_4_ = (int)(*palVar19)[0];
                  auVar67._0_8_ = auVar7._0_8_ << 0x20;
                  auVar67._8_4_ = *(undefined4 *)((long)*palVar19 + 4);
                  auVar67._12_4_ = (int)(*palVar19)[1];
                  auVar86._4_12_ = auVar67._4_12_;
                  auVar86._0_4_ = ptr_06[uVar25];
                  lVar24 = (long)ppVar4->mapper[(byte)s2[uVar25]] * size * 0x10;
                  auVar62._4_4_ = iVar16;
                  auVar62._0_4_ = iVar16;
                  auVar62._8_4_ = iVar16;
                  auVar62._12_4_ = iVar16;
                  auVar91._0_4_ = iVar16 - (int)(*ptr_04)[0];
                  auVar91._4_4_ = iVar16 - *(int *)((long)*ptr_04 + 4);
                  auVar91._8_4_ = iVar16 - (int)(*ptr_04)[1];
                  auVar91._12_4_ = iVar16 - *(int *)((long)*ptr_04 + 0xc);
                  auVar74 = (undefined1  [16])0x0;
                  lVar27 = 0;
                  local_1f8 = ZEXT816(0);
                  auVar72 = (undefined1  [16])0x0;
                  auVar67 = in_XMM4;
                  auVar69 = local_1c8;
                  local_1c8._0_4_ = 0;
                  local_1c8._4_4_ = (int)(*palVar20)[0];
                  local_1c8._8_4_ = *(int *)((long)*palVar20 + 4);
                  local_1c8._12_4_ = (int)(*palVar20)[1];
                  do {
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar27);
                    auVar79 = *pauVar2;
                    piVar1 = (int *)((long)*b + lVar27);
                    auVar55._0_4_ = *(int *)*pauVar2 - open;
                    auVar55._4_4_ = *(int *)(*pauVar2 + 4) - open;
                    auVar55._8_4_ = *(int *)(*pauVar2 + 8) - open;
                    auVar55._12_4_ = *(int *)(*pauVar2 + 0xc) - open;
                    auVar46._0_4_ = *piVar1 - gap;
                    auVar46._4_4_ = piVar1[1] - gap;
                    auVar46._8_4_ = piVar1[2] - gap;
                    auVar46._12_4_ = piVar1[3] - gap;
                    auVar36._0_4_ = -(uint)(auVar46._0_4_ < auVar55._0_4_);
                    auVar36._4_4_ = -(uint)(auVar46._4_4_ < auVar55._4_4_);
                    auVar36._8_4_ = -(uint)(auVar46._8_4_ < auVar55._8_4_);
                    auVar36._12_4_ = -(uint)(auVar46._12_4_ < auVar55._12_4_);
                    auVar56 = auVar55 & auVar36 | ~auVar36 & auVar46;
                    auVar46 = *(undefined1 (*) [16])((long)*b_03 + lVar27);
                    auVar47 = auVar46 & auVar36 |
                              ~auVar36 & *(undefined1 (*) [16])((long)*b_00 + lVar27);
                    auVar55 = *(undefined1 (*) [16])((long)*b_04 + lVar27);
                    auVar78 = auVar55 & auVar36 |
                              ~auVar36 & *(undefined1 (*) [16])((long)*b_01 + lVar27);
                    auVar37 = *(undefined1 (*) [16])((long)*b_05 + lVar27);
                    auVar36 = ~auVar36 & *(undefined1 (*) [16])((long)*b_02 + lVar27) |
                              auVar37 & auVar36;
                    piVar1 = (int *)((long)*ptr_04 + lVar27);
                    auVar90._0_4_ = auVar91._0_4_ + *piVar1;
                    auVar90._4_4_ = auVar91._4_4_ + piVar1[1];
                    auVar90._8_4_ = auVar91._8_4_ + piVar1[2];
                    auVar90._12_4_ = auVar91._12_4_ + piVar1[3];
                    auVar88._0_4_ = -(uint)(auVar62._0_4_ < auVar90._0_4_);
                    auVar88._4_4_ = -(uint)(auVar62._4_4_ < auVar90._4_4_);
                    auVar88._8_4_ = -(uint)(auVar62._8_4_ < auVar90._8_4_);
                    auVar88._12_4_ = -(uint)(auVar62._12_4_ < auVar90._12_4_);
                    auVar62 = ~auVar88 & auVar62 | auVar90 & auVar88;
                    auVar72 = auVar69 & auVar88 | ~auVar88 & auVar72;
                    piVar1 = (int *)((long)*ptr_05 + lVar27);
                    auVar69._0_4_ = auVar67._0_4_ + *piVar1;
                    auVar69._4_4_ = auVar67._4_4_ + piVar1[1];
                    auVar69._8_4_ = auVar67._8_4_ + piVar1[2];
                    auVar69._12_4_ = auVar67._12_4_ + piVar1[3];
                    local_1f8 = local_208 & auVar88 | ~auVar88 & local_1f8;
                    piVar1 = (int *)((long)pvVar3 + lVar27 + lVar24);
                    auVar85._0_4_ = auVar86._0_4_ + *piVar1;
                    auVar85._4_4_ = auVar86._4_4_ + piVar1[1];
                    auVar85._8_4_ = auVar86._8_4_ + piVar1[2];
                    auVar85._12_4_ = auVar86._12_4_ + piVar1[3];
                    piVar1 = (int *)((long)pvVar5 + lVar27 + lVar24);
                    auVar83._0_4_ = local_1c8._0_4_ + *piVar1;
                    auVar83._4_4_ = local_1c8._4_4_ + piVar1[1];
                    auVar83._8_4_ = local_1c8._8_4_ + piVar1[2];
                    auVar83._12_4_ = local_1c8._12_4_ + piVar1[3];
                    auVar74 = ~auVar88 & auVar74 | auVar69 & auVar88;
                    piVar1 = (int *)((long)pvVar6 + lVar27 + lVar24);
                    auVar80._0_4_ = local_108 + *piVar1;
                    auVar80._4_4_ = iStack_104 + piVar1[1];
                    auVar80._8_4_ = iStack_100 + piVar1[2];
                    auVar80._12_4_ = iStack_fc + piVar1[3];
                    auVar66._0_4_ = -(uint)(auVar85._0_4_ < auVar56._0_4_);
                    auVar66._4_4_ = -(uint)(auVar85._4_4_ < auVar56._4_4_);
                    auVar66._8_4_ = -(uint)(auVar85._8_4_ < auVar56._8_4_);
                    auVar66._12_4_ = -(uint)(auVar85._12_4_ < auVar56._12_4_);
                    *(undefined1 (*) [16])((long)*b + lVar27) = auVar56;
                    auVar91 = ~auVar66 & auVar85 | auVar56 & auVar66;
                    *(undefined1 (*) [16])((long)*b_00 + lVar27) = auVar47;
                    auVar69 = ~auVar66 & auVar83 | auVar47 & auVar66;
                    *(undefined1 (*) [16])((long)*b_01 + lVar27) = auVar78;
                    auVar78 = auVar78 & auVar66;
                    local_208 = ~auVar66 & auVar80 | auVar78;
                    auVar47._0_4_ = auVar36._0_4_ + 1;
                    auVar47._4_4_ = auVar36._4_4_ + 1;
                    auVar47._8_4_ = auVar36._8_4_ + 1;
                    auVar47._12_4_ = auVar36._12_4_ + 1;
                    local_f8 = (int)local_118;
                    iStack_f4 = (int)((ulong)local_118 >> 0x20);
                    iStack_f0 = (int)uStack_110;
                    iStack_ec = (int)(uStack_110 >> 0x20);
                    auVar56._0_4_ = local_f8 + 1;
                    auVar56._4_4_ = iStack_f4 + 1;
                    auVar56._8_4_ = iStack_f0 + 1;
                    auVar56._12_4_ = iStack_ec + 1;
                    *(undefined1 (*) [16])((long)*b_02 + lVar27) = auVar47;
                    auVar67 = ~auVar66 & auVar56 | auVar47 & auVar66;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar85;
                    *(undefined1 (*) [16])((long)*b_03 + lVar27) = auVar83;
                    *(undefined1 (*) [16])((long)*b_04 + lVar27) = auVar80;
                    *(undefined1 (*) [16])((long)*b_05 + lVar27) = auVar56;
                    lVar27 = lVar27 + 0x10;
                    local_118 = auVar37._0_8_;
                    uStack_110 = auVar37._8_8_;
                    local_108 = auVar55._0_4_;
                    iStack_104 = auVar55._4_4_;
                    iStack_100 = auVar55._8_4_;
                    iStack_fc = auVar55._12_4_;
                    local_1c8._0_4_ = auVar46._0_4_;
                    local_1c8._4_4_ = auVar46._4_4_;
                    local_1c8._8_4_ = auVar46._8_4_;
                    local_1c8._12_4_ = auVar46._12_4_;
                    auVar86 = auVar79;
                  } while (lVar33 != lVar27);
                  local_1c8._0_8_ = auVar69._0_8_ << 0x20;
                  local_1c8._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                  lVar24 = local_208._8_8_;
                  uVar75 = local_208._0_8_;
                  local_208._0_8_ = uVar75 << 0x20;
                  local_208._8_8_ = lVar24 << 0x20 | uVar75 >> 0x20;
                  in_XMM4._0_8_ = auVar67._0_8_ << 0x20;
                  in_XMM4._8_8_ = auVar67._8_8_ << 0x20 | auVar67._0_8_ >> 0x20;
                  iVar59 = auVar91._0_4_;
                  iVar60 = auVar91._4_4_;
                  iVar61 = auVar91._8_4_;
                  auVar8._4_8_ = auVar78._8_8_;
                  auVar8._0_4_ = iVar59;
                  auVar79._0_8_ = auVar8._0_8_ << 0x20;
                  auVar79._8_4_ = iVar60;
                  auVar79._12_4_ = iVar61;
                  iVar28 = ptr_06[uVar25 + 1];
                  uVar25 = uVar25 + 1;
                  auVar78._4_12_ = auVar79._4_12_;
                  auVar78._0_4_ = iVar28;
                  auVar37._0_4_ = (int)(*ptr_04)[0] + iVar28;
                  auVar37._4_4_ = *(int *)((long)*ptr_04 + 4) + iVar59;
                  auVar37._8_4_ = (int)(*ptr_04)[1] + iVar60;
                  auVar37._12_4_ = *(int *)((long)*ptr_04 + 0xc) + iVar61;
                  auVar89._0_4_ = -(uint)(auVar37._0_4_ < auVar62._0_4_);
                  auVar89._4_4_ = -(uint)(auVar37._4_4_ < auVar62._4_4_);
                  auVar89._8_4_ = -(uint)(auVar37._8_4_ < auVar62._8_4_);
                  auVar89._12_4_ = -(uint)(auVar37._12_4_ < auVar62._12_4_);
                  auVar62 = auVar62 & auVar89 | ~auVar89 & auVar37;
                  auVar69 = auVar72 & auVar89 | ~auVar89 & local_1c8;
                  auVar86 = local_1f8 & auVar89 | ~auVar89 & local_208;
                  auVar72._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar67._0_4_;
                  auVar72._0_4_ = (int)(*ptr_05)[0];
                  auVar72._8_4_ = (int)(*ptr_05)[1] + auVar67._4_4_;
                  auVar72._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar67._8_4_;
                  auVar67 = ~auVar89 & auVar72 | auVar74 & auVar89;
                  iVar54 = 1;
                  do {
                    auVar74._4_4_ = auVar67._4_4_ + iVar32;
                    auVar74._0_4_ = auVar67._0_4_ + iVar32;
                    auVar74._8_4_ = auVar67._8_4_ + iVar32;
                    auVar74._12_4_ = 0;
                    auVar48._4_4_ = auVar62._0_4_ + iVar12;
                    auVar48._0_4_ = iVar16;
                    auVar48._8_4_ = auVar62._4_4_ + iVar12;
                    auVar48._12_4_ = auVar62._8_4_ + iVar12;
                    auVar57._0_4_ = -(uint)(iVar16 < auVar62._0_4_);
                    auVar57._4_4_ = -(uint)(auVar48._4_4_ < auVar62._4_4_);
                    auVar57._8_4_ = -(uint)(auVar48._8_4_ < auVar62._8_4_);
                    auVar57._12_4_ = -(uint)(auVar48._12_4_ < auVar62._12_4_);
                    auVar62 = auVar62 & auVar57 | ~auVar57 & auVar48;
                    auVar49._0_8_ = auVar69._0_8_ << 0x20;
                    auVar49._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                    auVar69 = auVar69 & auVar57 | ~auVar57 & auVar49;
                    auVar50._0_8_ = auVar86._0_8_ << 0x20;
                    auVar50._8_8_ = auVar86._8_8_ << 0x20 | auVar86._0_8_ >> 0x20;
                    auVar86 = auVar86 & auVar57 | ~auVar57 & auVar50;
                    auVar67 = ~auVar57 & auVar74 << 0x20 | auVar67 & auVar57;
                    iVar54 = iVar54 + -1;
                  } while (iVar54 == 0);
                  auVar73._0_8_ = auVar69._0_8_ << 0x20;
                  auVar73._8_8_ = auVar69._8_8_ << 0x20 | auVar69._0_8_ >> 0x20;
                  auVar84._0_8_ = auVar86._0_8_ << 0x20;
                  auVar84._8_8_ = auVar86._8_8_ << 0x20 | auVar86._0_8_ >> 0x20;
                  auVar82._0_8_ = auVar67._0_8_ << 0x20;
                  auVar82._8_8_ = auVar67._8_8_ << 0x20 | auVar67._0_8_ >> 0x20;
                  auVar64._4_4_ = auVar62._0_4_;
                  auVar64._0_4_ = iVar16;
                  auVar64._8_4_ = auVar62._4_4_;
                  auVar64._12_4_ = auVar62._8_4_;
                  auVar38._0_4_ = -(uint)(iVar28 < iVar16);
                  auVar38._4_4_ = -(uint)(iVar59 < auVar64._4_4_);
                  auVar38._8_4_ = -(uint)(iVar60 < auVar64._8_4_);
                  auVar38._12_4_ = -(uint)(iVar61 < auVar64._12_4_);
                  auVar62 = ~auVar38 & auVar78 | auVar64 & auVar38;
                  auVar67 = auVar73 & auVar38 | ~auVar38 & local_1c8;
                  auVar69 = auVar84 & auVar38 | ~auVar38 & local_208;
                  in_XMM13 = ~auVar38 & in_XMM4 | auVar82 & auVar38;
                  lVar27 = 0;
                  lVar24 = local_170;
                  do {
                    auVar76._0_4_ = auVar62._0_4_ - open;
                    auVar76._4_4_ = auVar62._4_4_ - open;
                    auVar76._8_4_ = auVar62._8_4_ - open;
                    auVar76._12_4_ = auVar62._12_4_ - open;
                    auVar63._0_4_ = auVar64._0_4_ - gap;
                    auVar63._4_4_ = auVar64._4_4_ - gap;
                    auVar63._8_4_ = auVar64._8_4_ - gap;
                    auVar63._12_4_ = auVar64._12_4_ - gap;
                    auVar81._0_4_ = -(uint)(auVar63._0_4_ < auVar76._0_4_);
                    auVar81._4_4_ = -(uint)(auVar63._4_4_ < auVar76._4_4_);
                    auVar81._8_4_ = -(uint)(auVar63._8_4_ < auVar76._8_4_);
                    auVar81._12_4_ = -(uint)(auVar63._12_4_ < auVar76._12_4_);
                    auVar86 = *(undefined1 (*) [16])((long)*ptr + lVar27);
                    auVar64 = auVar76 & auVar81 | ~auVar81 & auVar63;
                    auVar62 = *(undefined1 (*) [16])((long)*b + lVar27);
                    auVar72 = ~auVar81 & auVar82 | in_XMM13 & auVar81;
                    auVar73 = auVar67 & auVar81 | ~auVar81 & auVar73;
                    auVar77._0_4_ = -(uint)(auVar62._0_4_ < auVar86._0_4_);
                    auVar77._4_4_ = -(uint)(auVar62._4_4_ < auVar86._4_4_);
                    auVar77._8_4_ = -(uint)(auVar62._8_4_ < auVar86._8_4_);
                    auVar77._12_4_ = -(uint)(auVar62._12_4_ < auVar86._12_4_);
                    auVar84 = auVar69 & auVar81 | ~auVar81 & auVar84;
                    auVar62 = ~auVar77 & auVar62 | auVar86 & auVar77;
                    auVar39._0_4_ = -(uint)(auVar64._0_4_ < auVar62._0_4_);
                    auVar39._4_4_ = -(uint)(auVar64._4_4_ < auVar62._4_4_);
                    auVar39._8_4_ = -(uint)(auVar64._8_4_ < auVar62._8_4_);
                    auVar39._12_4_ = -(uint)(auVar64._12_4_ < auVar62._12_4_);
                    auVar62 = auVar62 & auVar39 | ~auVar39 & auVar64;
                    iVar28 = auVar62._0_4_;
                    auVar87._0_4_ = -(uint)(auVar86._0_4_ == iVar28);
                    iVar54 = auVar62._4_4_;
                    auVar87._4_4_ = -(uint)(auVar86._4_4_ == iVar54);
                    iVar59 = auVar62._8_4_;
                    auVar87._8_4_ = -(uint)(auVar86._8_4_ == iVar59);
                    iVar60 = auVar62._12_4_;
                    auVar87._12_4_ = -(uint)(auVar86._12_4_ == iVar60);
                    auVar67 = *(undefined1 (*) [16])((long)*b_03 + lVar27) & auVar87 |
                              ~auVar87 &
                              (~auVar39 & auVar73 |
                              *(undefined1 (*) [16])((long)*b_00 + lVar27) & auVar39);
                    auVar69 = *(undefined1 (*) [16])((long)*b_04 + lVar27) & auVar87 |
                              ~auVar87 &
                              (~auVar39 & auVar84 |
                              *(undefined1 (*) [16])((long)*b_01 + lVar27) & auVar39);
                    auVar82._0_4_ = auVar72._0_4_ + 1;
                    auVar82._4_4_ = auVar72._4_4_ + 1;
                    auVar82._8_4_ = auVar72._8_4_ + 1;
                    auVar82._12_4_ = auVar72._12_4_ + 1;
                    in_XMM13 = auVar87 & *(undefined1 (*) [16])((long)*b_05 + lVar27) |
                               ~auVar87 &
                               (~auVar39 & auVar82 |
                               *(undefined1 (*) [16])((long)*b_02 + lVar27) & auVar39);
                    auVar51._0_4_ = -(uint)(iVar28 < local_148._0_4_);
                    auVar51._4_4_ = -(uint)(iVar54 < local_148._4_4_);
                    auVar51._8_4_ = -(uint)(iVar59 < local_148._8_4_);
                    auVar51._12_4_ = -(uint)(iVar60 < local_148._12_4_);
                    auVar40._0_4_ = -(uint)(iVar28 < local_158._0_4_);
                    auVar40._4_4_ = -(uint)(iVar54 < local_158._4_4_);
                    auVar40._8_4_ = -(uint)(iVar59 < local_158._8_4_);
                    auVar40._12_4_ = -(uint)(iVar60 < local_158._12_4_);
                    auVar86 = ~auVar40 & auVar62 | local_158 & auVar40;
                    *(undefined1 (*) [16])((long)*ptr + lVar27) = auVar62;
                    *(undefined1 (*) [16])((long)*b_03 + lVar27) = auVar67;
                    *(undefined1 (*) [16])((long)*b_04 + lVar27) = auVar69;
                    *(undefined1 (*) [16])((long)*b_05 + lVar27) = in_XMM13;
                    local_148 = ~auVar51 & local_148 | auVar62 & auVar51;
                    lVar15 = *((ppVar14->field_4).trace)->trace_del_table;
                    *(int *)(lVar15 + lVar24) = iVar28;
                    lVar15 = lVar15 + lVar24;
                    *(int *)(lVar17 + lVar15) = iVar54;
                    *(int *)(lVar30 + lVar15) = iVar59;
                    *(int *)(lVar29 + lVar15) = iVar60;
                    auVar52._0_4_ = -(uint)(auVar67._0_4_ < auVar86._0_4_);
                    auVar52._4_4_ = -(uint)(auVar67._4_4_ < auVar86._4_4_);
                    auVar52._8_4_ = -(uint)(auVar67._8_4_ < auVar86._8_4_);
                    auVar52._12_4_ = -(uint)(auVar67._12_4_ < auVar86._12_4_);
                    auVar86 = ~auVar52 & auVar67 | auVar86 & auVar52;
                    lVar15 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar15 + lVar24) = auVar67._0_4_;
                    lVar15 = lVar15 + lVar24;
                    *(int *)(lVar17 + lVar15) = auVar67._4_4_;
                    *(int *)(lVar30 + lVar15) = auVar67._8_4_;
                    *(int *)(lVar29 + lVar15) = auVar67._12_4_;
                    auVar41._0_4_ = -(uint)(auVar69._0_4_ < auVar86._0_4_);
                    auVar41._4_4_ = -(uint)(auVar69._4_4_ < auVar86._4_4_);
                    auVar41._8_4_ = -(uint)(auVar69._8_4_ < auVar86._8_4_);
                    auVar41._12_4_ = -(uint)(auVar69._12_4_ < auVar86._12_4_);
                    auVar86 = ~auVar41 & auVar69 | auVar86 & auVar41;
                    lVar15 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar15 + lVar24) = auVar69._0_4_;
                    lVar15 = lVar15 + lVar24;
                    *(int *)(lVar17 + lVar15) = auVar69._4_4_;
                    *(int *)(lVar30 + lVar15) = auVar69._8_4_;
                    *(int *)(lVar29 + lVar15) = auVar69._12_4_;
                    auVar70._0_4_ = -(uint)(in_XMM13._0_4_ < auVar86._0_4_);
                    auVar70._4_4_ = -(uint)(in_XMM13._4_4_ < auVar86._4_4_);
                    auVar70._8_4_ = -(uint)(in_XMM13._8_4_ < auVar86._8_4_);
                    auVar70._12_4_ = -(uint)(in_XMM13._12_4_ < auVar86._12_4_);
                    local_158 = ~auVar70 & in_XMM13 | auVar86 & auVar70;
                    lVar15 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar15 + lVar24) = in_XMM13._0_4_;
                    lVar15 = lVar15 + lVar24;
                    *(int *)(lVar17 + lVar15) = in_XMM13._4_4_;
                    *(int *)(lVar30 + lVar15) = in_XMM13._8_4_;
                    *(int *)(lVar29 + lVar15) = in_XMM13._12_4_;
                    lVar27 = lVar27 + 0x10;
                    lVar24 = lVar24 + uVar31 * 4;
                  } while (lVar33 != lVar27);
                  local_170 = local_170 + 4;
                } while (uVar25 != uVar18);
                iVar28 = uVar34 * 0x10;
                alVar68 = ptr[uVar34];
                alVar58 = b_03[uVar34];
                alVar53 = b_04[uVar34];
                alVar42 = b_05[uVar34];
                if (iVar26 / iVar32 < 3) {
                  iVar28 = 1;
                  if (1 < iVar11) {
                    iVar28 = iVar11;
                  }
                  do {
                    lVar17 = alVar68[1];
                    uVar31 = alVar68[0];
                    alVar68[0] = uVar31 << 0x20;
                    alVar68[1] = lVar17 << 0x20 | uVar31 >> 0x20;
                    lVar17 = alVar58[1];
                    uVar31 = alVar58[0];
                    alVar58[0] = uVar31 << 0x20;
                    alVar58[1] = lVar17 << 0x20 | uVar31 >> 0x20;
                    lVar17 = alVar53[1];
                    uVar31 = alVar53[0];
                    alVar53[0] = uVar31 << 0x20;
                    alVar53[1] = lVar17 << 0x20 | uVar31 >> 0x20;
                    lVar17 = alVar42[1];
                    uVar31 = alVar42[0];
                    alVar42[0] = uVar31 << 0x20;
                    alVar42[1] = lVar17 << 0x20 | uVar31 >> 0x20;
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                }
                auVar65._0_4_ = -(uint)((int)local_148._0_4_ < iVar16);
                auVar65._4_4_ = -(uint)((int)local_148._4_4_ < iVar16);
                auVar65._8_4_ = -(uint)((int)local_148._8_4_ < iVar16);
                auVar65._12_4_ = -(uint)((int)local_148._12_4_ < iVar16);
                auVar71._0_4_ = -(uint)(iVar9 < (int)local_158._0_4_);
                auVar71._4_4_ = -(uint)(iVar9 < (int)local_158._4_4_);
                auVar71._8_4_ = -(uint)(iVar9 < (int)local_158._8_4_);
                auVar71._12_4_ = -(uint)(iVar9 < (int)local_158._12_4_);
                iVar9 = movmskps(iVar28,auVar71 | auVar65);
                if (iVar9 == 0) {
                  iVar9 = alVar68[1]._4_4_;
                  iVar28 = alVar58[1]._4_4_;
                  iVar32 = alVar53[1]._4_4_;
                  iVar54 = alVar42[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                  iVar9 = 0;
                  iVar28 = 0;
                  iVar32 = 0;
                  iVar54 = 0;
                  iVar10 = 0;
                  iVar26 = 0;
                }
                ppVar14->score = iVar9;
                ppVar14->end_query = iVar26;
                ppVar14->end_ref = iVar10;
                ((ppVar14->field_4).stats)->matches = iVar28;
                ((ppVar14->field_4).stats)->similar = iVar32;
                ((ppVar14->field_4).stats)->length = iVar54;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar14;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32_rpl(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32_rpl(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32_rpl(vHp, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        matches = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
        similar = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
        length = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}